

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O0

unsigned_long __thiscall
duckdb::BitReader::ReadBytes<unsigned_long>(BitReader *this,uint8_t *bytes,uint8_t *remainder)

{
  byte bVar1;
  byte bVar2;
  byte *in_RDX;
  BitReader *in_RSI;
  uint8_t *in_RDI;
  BitReader *unaff_retaddr;
  uint8_t i;
  unsigned_long result;
  byte local_21;
  ulong local_20;
  uint8_t *size;
  
  local_20 = 0;
  size = in_RDI;
  for (local_21 = 0; local_21 < *(byte *)&in_RSI->input; local_21 = local_21 + 1) {
    bVar1 = InnerReadByte(in_RSI,in_RDX);
    local_20 = local_20 << 8 | (ulong)bVar1;
  }
  bVar1 = *in_RDX;
  bVar2 = InnerRead(unaff_retaddr,size,(uint8_t *)in_RSI);
  *(uint *)(in_RDI + 8) = (uint)*(byte *)&in_RSI->input * 8 + (uint)*in_RDX + *(int *)(in_RDI + 8);
  return local_20 << (bVar1 & 0x3f) | (ulong)bVar2;
}

Assistant:

inline T ReadBytes(const uint8_t &bytes, const uint8_t &remainder) {
		T result = 0;
		for (uint8_t i = 0; i < bytes; i++) {
			result = result << 8 | InnerReadByte(i);
		}
		result = result << remainder | InnerRead(remainder, bytes);
		index += static_cast<uint32_t>(bytes << 3) + remainder;
		return result;
	}